

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O1

bool __thiscall SubCircuit<4>::propagateCheck(SubCircuit<4> *this)

{
  uint size;
  IntView<4> *pIVar1;
  bool *pbVar2;
  IntVar *pIVar3;
  vec<int> *pvVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  uint i;
  size_t __n;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int *__ptr;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  uint size_00;
  ulong uVar16;
  int iVar17;
  Clause *reason;
  bool bVar18;
  bool bVar19;
  vec<int> failIndices;
  vec<int> notInCycle;
  vec<int> local_c8;
  vec<int> local_b8;
  Clause *local_a0;
  vec<int> local_98;
  vec<int> local_88;
  vec<int> local_78;
  vec<int> local_68;
  vec<int> local_58;
  vec<int> local_48;
  ulong local_38;
  
  if ((this->new_fixed).sz == 0) {
    bVar19 = true;
  }
  else {
    uVar9 = 0;
    do {
      iVar17 = (this->new_fixed).data[uVar9];
      __n = (size_t)*(int *)&(this->super_Propagator).field_0x14;
      if (0 < (long)__n) {
        memset(this->inCircuit,0,__n);
      }
      lVar7 = (long)iVar17;
      pIVar1 = this->x;
      iVar6 = ((pIVar1[lVar7].var)->min).v;
      uVar16 = 0;
      bVar19 = iVar6 == ((pIVar1[lVar7].var)->max).v;
      if (bVar19) {
        pbVar2 = this->inCircuit;
        pbVar2[lVar7] = true;
        lVar11 = (long)pIVar1[lVar7].b + (long)iVar6;
        uVar16 = 1;
        if (lVar11 != lVar7) {
          uVar16 = 1;
          do {
            iVar10 = (int)lVar11;
            iVar6 = ((pIVar1[iVar10].var)->min).v;
            bVar19 = iVar6 == ((pIVar1[iVar10].var)->max).v;
            if (!bVar19) break;
            uVar16 = (ulong)((int)uVar16 + 1);
            pbVar2[iVar10] = true;
            lVar11 = (long)pIVar1[iVar10].b + (long)iVar6;
          } while (lVar11 != lVar7);
        }
      }
      size = *(uint *)&(this->super_Propagator).field_0x14;
      size_00 = (uint)uVar16;
      if (((int)size_00 < (int)size & bVar19) != 1) goto LAB_00145809;
      local_b8.sz = 0;
      local_b8.cap = 0;
      local_b8.data = (int *)0x0;
      if (so.lazy != true) {
        reason = (Clause *)0x0;
        goto LAB_00145666;
      }
      if (so.checkexpl == 1) {
        local_c8._0_8_ = malloc((long)(int)size_00 * 4 + 0xc);
        *(uint *)local_c8._0_8_ = (*(uint *)local_c8._0_8_ & 0xfc) + size_00 * 0x100 + 0x102;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)&local_c8);
        reason = (Clause *)local_c8._0_8_;
        if (0 < (int)size_00) {
          uVar16 = 1;
          local_38 = uVar9;
          do {
            iVar6 = (*((this->x[iVar17].var)->super_Var).super_Branching._vptr_Branching[10])();
            if (*(uint *)reason >> 8 <= uVar16) goto LAB_00145851;
            ((Lit *)((long)reason + 4))[uVar16].x = iVar6;
            iVar17 = this->x[iVar17].b + ((this->x[iVar17].var)->min).v;
            uVar16 = uVar16 + 1;
            uVar9 = local_38;
          } while (size_00 + 1 != uVar16);
        }
        goto LAB_00145666;
      }
      vec<int>::growTo(&local_b8,size);
      if (0 < *(int *)&(this->super_Propagator).field_0x14) {
        lVar7 = 0;
        do {
          local_b8.data[lVar7] = (int)lVar7;
          lVar7 = lVar7 + 1;
        } while (lVar7 < *(int *)&(this->super_Propagator).field_0x14);
      }
      local_c8._0_8_ = (Clause *)0x0;
      local_c8.data = (int *)0x0;
      vec<int>::growTo(&local_c8,size_00);
      if (0 < (int)size_00) {
        pIVar1 = this->x;
        uVar8 = 0;
        do {
          local_c8.data[uVar8] = iVar17;
          uVar12 = local_b8._0_8_ & 0xffffffff;
          if (uVar12 != 0) {
            if (*local_b8.data == iVar17) {
              bVar18 = true;
              uVar13 = 0;
            }
            else {
              uVar14 = 0;
              do {
                if (uVar12 - 1 == uVar14) goto LAB_00145333;
                uVar13 = uVar14 + 1;
                lVar7 = uVar14 + 1;
                uVar14 = uVar13;
              } while (local_b8.data[lVar7] != iVar17);
              bVar18 = uVar13 < uVar12;
            }
            if (bVar18) {
              local_b8.data[uVar13] = local_b8.data[local_b8.sz - 1];
              local_b8.sz = local_b8.sz - 1;
            }
          }
LAB_00145333:
          iVar17 = pIVar1[iVar17].b + ((pIVar1[iVar17].var)->min).v;
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar16);
      }
      iVar17 = local_b8.sz * local_c8.sz + 2;
      local_a0 = (Clause *)malloc((long)iVar17 * 4 + 8);
      *(uint *)local_a0 = (*(uint *)local_a0 & 0xfc) + iVar17 * 0x100 + 2;
      vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_a0);
      reason = local_a0;
      uVar16 = local_c8._0_8_ & 0xffffffff;
      local_48.sz = local_c8.sz;
      local_48.cap = local_c8.sz;
      local_48.data = (int *)malloc(uVar16 * 4);
      if (uVar16 != 0) {
        uVar8 = 0;
        do {
          local_48.data[uVar8] = local_c8.data[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar16 != uVar8);
      }
      iVar17 = chooseEvidenceVar(this,&local_48,so.checkevidence);
      if (local_48.data != (int *)0x0) {
        free(local_48.data);
      }
      local_48.data = (int *)0x0;
      lVar7 = (long)iVar17;
      pIVar3 = this->x[lVar7].var;
      iVar17 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xd])
                         (pIVar3,lVar7 - this->x[lVar7].b,1);
      if (*(uint *)reason < 0x200) {
LAB_00145851:
        abort();
      }
      *(int *)(reason + 1) = iVar17;
      switch(so.checkexpl) {
      case 3:
        goto switchD_0014548d_caseD_3;
      case 4:
        bVar18 = local_b8.sz < local_c8.sz;
        goto LAB_001454a1;
      case 5:
        bVar18 = local_c8.sz < local_b8.sz;
LAB_001454a1:
        if (!bVar18) goto switchD_0014548d_caseD_2;
switchD_0014548d_caseD_3:
        uVar16 = local_b8._0_8_ & 0xffffffff;
        local_58.sz = local_b8.sz;
        local_58.cap = local_b8.sz;
        local_58.data = (int *)malloc(uVar16 * 4);
        if (uVar16 != 0) {
          uVar8 = 0;
          do {
            local_58.data[uVar8] = local_b8.data[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar16 != uVar8);
        }
        uVar16 = local_c8._0_8_ & 0xffffffff;
        local_68.sz = local_c8.sz;
        local_68.cap = local_c8.sz;
        local_68.data = (int *)malloc(uVar16 * 4);
        if (uVar16 != 0) {
          uVar8 = 0;
          do {
            local_68.data[uVar8] = local_c8.data[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar16 != uVar8);
        }
        explainAcantreachB(this,reason,2,&local_58,&local_68,-1,-1);
        if (local_68.data != (int *)0x0) {
          free(local_68.data);
        }
        local_68.data = (int *)0x0;
        pvVar4 = &local_58;
        __ptr = local_58.data;
        break;
      default:
        propagateCheck();
      case 2:
switchD_0014548d_caseD_2:
        uVar16 = local_c8._0_8_ & 0xffffffff;
        local_78.sz = local_c8.sz;
        local_78.cap = local_c8.sz;
        local_78.data = (int *)malloc(uVar16 * 4);
        if (uVar16 != 0) {
          uVar8 = 0;
          do {
            local_78.data[uVar8] = local_c8.data[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar16 != uVar8);
        }
        uVar16 = local_b8._0_8_ & 0xffffffff;
        local_88.sz = local_b8.sz;
        local_88.cap = local_b8.sz;
        local_88.data = (int *)malloc(uVar16 * 4);
        if (uVar16 != 0) {
          uVar8 = 0;
          do {
            local_88.data[uVar8] = local_b8.data[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar16 != uVar8);
        }
        explainAcantreachB(this,reason,2,&local_78,&local_88,-1,-1);
        if (local_88.data != (int *)0x0) {
          free(local_88.data);
        }
        local_88.data = (int *)0x0;
        pvVar4 = &local_78;
        __ptr = local_78.data;
      }
      if (__ptr != (int *)0x0) {
        free(__ptr);
      }
      pvVar4->data = (int *)0x0;
      if (local_c8.data != (int *)0x0) {
        free(local_c8.data);
      }
LAB_00145666:
      local_c8.sz = 0;
      local_c8.cap = 0;
      local_c8.data = (int *)0x0;
      local_a0 = (Clause *)((ulong)local_a0 & 0xffffffff00000000);
      if (0 < *(int *)&(this->super_Propagator).field_0x14) {
        iVar17 = 0;
        do {
          lVar7 = (long)iVar17;
          if (this->inCircuit[lVar7] == false) {
            pIVar3 = this->x[lVar7].var;
            iVar17 = (pIVar3->min).v;
            iVar6 = (pIVar3->max).v;
            lVar11 = (long)this->x[lVar7].b;
            if ((iVar17 != iVar6) || (lVar11 + iVar17 != lVar7)) {
              lVar7 = lVar7 - lVar11;
              if (((lVar7 < iVar17) || (iVar6 < lVar7)) ||
                 ((pIVar3->vals != (Tchar *)0x0 && (pIVar3->vals[lVar7].v == '\0')))) {
                vec<int>::push(&local_c8,(int *)&local_a0);
              }
              else {
                iVar17 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0x10])
                                   (pIVar3,lVar7,reason,1);
                if ((char)iVar17 == '\0') {
                  propagateCheck();
                }
              }
            }
          }
          iVar17 = (int)local_a0 + 1;
          local_a0 = (Clause *)CONCAT44(local_a0._4_4_,iVar17);
        } while (iVar17 < *(int *)&(this->super_Propagator).field_0x14);
      }
      uVar16 = local_c8._0_8_ & 0xffffffff;
      if (uVar16 == 0) {
        if (local_c8.data != (int *)0x0) {
          free(local_c8.data);
        }
        if (local_b8.data != (int *)0x0) {
          free(local_b8.data);
        }
LAB_00145809:
        bVar15 = bVar19 ^ 1;
        cVar5 = bVar19 * '\x02';
      }
      else {
        local_98.sz = local_c8.sz;
        local_98.cap = local_c8.sz;
        local_98.data = (int *)malloc(uVar16 * 4);
        uVar8 = 0;
        do {
          local_98.data[uVar8] = local_c8.data[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar16 != uVar8);
        iVar17 = chooseEvidenceVar(this,&local_98,so.checkevidence);
        if (local_98.data != (int *)0x0) {
          free(local_98.data);
        }
        local_98.data = (int *)0x0;
        lVar7 = (long)iVar17;
        pIVar3 = this->x[lVar7].var;
        iVar17 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0x10])
                           (pIVar3,lVar7 - this->x[lVar7].b,reason,1);
        if ((char)iVar17 != '\0') {
          propagateCheck();
        }
        if (local_c8.data != (int *)0x0) {
          free(local_c8.data);
        }
        if (local_b8.data != (int *)0x0) {
          free(local_b8.data);
        }
        cVar5 = '\x01';
        bVar15 = 0;
      }
      if (bVar15 == 0) goto LAB_00145839;
      uVar9 = uVar9 + 1;
    } while (uVar9 < (this->new_fixed).sz);
    cVar5 = '\x02';
LAB_00145839:
    bVar19 = cVar5 == '\x02';
  }
  return bVar19;
}

Assistant:

bool propagateCheck() {
		// for each newly fixed variable, follow the chain and if you find a circuit
		// then any variable not in the circuit must have its own index as a value
		for (unsigned int i = 0; i < new_fixed.size(); i++) {
			// new_fixed should only contain variables fixed to values other than their own indices
			const int startVar = new_fixed[i];
			assert(x[startVar].isFixed());
			assert(x[startVar].getVal() != startVar);
			int nextVar = startVar;
			int chainLength = 0;

			// Clear the inCircuit array
			for (int i = 0; i < size; i++) {
				inCircuit[i] = false;
			}

			bool foundCycle = false;
			while (x[nextVar].isFixed()) {
				chainLength++;
				inCircuit[nextVar] = true;
				assert(chainLength <= size);
				if (x[nextVar].getVal() == startVar) {
					foundCycle = true;
					break;
				}
				nextVar = static_cast<int>(x[nextVar].getVal());
			}
			if (foundCycle && chainLength < size) {
				// fprintf(stderr,"found cycle length %d\n", chainLength);
				//  all variables not in the cycle must have their own indices as values
				Clause* r = nullptr;
				vec<int> notInCycle;
				bool doOutsideIn = false;
				if (so.lazy) {
					/*  r = Reason_new(chainLength + 1);
						int v = startVar;
						for(int j = 1 ; j <= chainLength; j++)
						{
								(*r)[j] = x[v].getValLit();
								v = x[v].getVal();
						}*/
					if (so.checkexpl == 1) {
						// equalities
						r = Reason_new(chainLength + 1);
						int v = startVar;
						for (int j = 1; j <= chainLength; j++) {
							(*r)[j] = x[v].getValLit();
							v = static_cast<int>(x[v].getVal());
						}
					} else {
						// find the vars in and not in the cycle
						notInCycle.growTo(size);
						for (int i = 0; i < size; i++) {
							notInCycle[i] = i;
						}
						vec<int> inCycle;
						inCycle.growTo(chainLength);
						int v = startVar;
						for (int j = 0; j < chainLength; j++) {
							inCycle[j] = v;
							notInCycle.remove(v);
							v = static_cast<int>(x[v].getVal());
						}
						r = Reason_new(inCycle.size() * notInCycle.size() + 2);
						// the first literal is an evidence literal from inside the circuit
						// choose the one from the highest level?
						const int chosenVar = chooseEvidenceVar(inCycle, so.checkevidence);
						(*r)[1] = x[chosenVar].getLit(chosenVar, LR_EQ);  // xi == i (is false)

						if (so.checkexpl == 2) {  // inside can't reach out
							doOutsideIn = false;
						} else if (so.checkexpl == 3) {  // outside can't reach in
							doOutsideIn = true;
						} else if (so.checkexpl == 4) {  // smaller group can't reach bigger group
							doOutsideIn = notInCycle.size() < inCycle.size();
						} else if (so.checkexpl == 5) {  // bigger group can't reach smaller group
							doOutsideIn = inCycle.size() < notInCycle.size();
						} else {
							fprintf(stderr, "Unknown check explanation type\n");
						}

						if (doOutsideIn) {
							explainAcantreachB(r, 2, notInCycle, inCycle);
						} else {
							explainAcantreachB(r, 2, inCycle, notInCycle);
						}
					}
				}

				// set all vars not in circuit to have own index as value
				// if one or more cannot do so, we need to choose which one(s)
				// to add clauses for.
				// options are: 1-first, 2-last, 3-high level, 4-low level
				vec<int> failIndices;
				for (int i = 0; i < size; i++) {
					if (!inCircuit[i]) {
						if (x[i].setValNotR(i)) {
							if (!x[i].remValNotR(i)) {
								failIndices.push(i);
								// fprintf(stderr,"prune\n");
							} else if (!x[i].setVal(i, r)) {
								fprintf(stderr, "unexpected fail\n");
							}
						}
					}
				}
				// now do the failing one(s) if there are any
				if (failIndices.size() > 0) {
					const int chosenIndex = chooseEvidenceVar(failIndices, so.checkevidence);
					if (x[chosenIndex].setVal(chosenIndex, r)) {
						fprintf(stderr, "unexpected success\n");
					}
					return false;
				}
			}

			// If we found a cycle stop here as all other fixed vars will be in the
			// same cycle (or we would have returned false already).
			if (foundCycle) {
				break;
			}
		}

		return true;
	}